

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

void __thiscall BigInteger::BigInteger(BigInteger *this,string *s)

{
  byte bVar1;
  iterator iVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  runtime_error *this_00;
  uint *puVar6;
  uint *puVar7;
  pointer pcVar8;
  uint temp;
  uint local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  *(undefined8 *)
   ((long)&(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c = 0;
  if (s->_M_string_length != 0) {
    pcVar8 = (s->_M_dataplus)._M_p + s->_M_string_length;
    iVar5 = 1;
    uVar4 = 0;
    do {
      bVar1 = pcVar8[-1];
      if (bVar1 != 0x2b) {
        if (bVar1 == 0x2d) {
          this->negative = true;
        }
        else {
          if ((byte)(bVar1 - 0x3a) < 0xf6) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_48,"Invalid integer: ",s);
            std::runtime_error::runtime_error(this_00,(string *)&local_48);
            *(undefined ***)this_00 = &PTR__runtime_error_0015ed40;
            __cxa_throw(this_00,&invalid_number_error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar4 = uVar4 + (bVar1 - 0x30) * iVar5;
          iVar5 = iVar5 * 10;
          local_4c = uVar4;
          if (iVar5 == 1000000000) {
            iVar2._M_current =
                 (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&local_4c);
            }
            else {
              *iVar2._M_current = uVar4;
              (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            local_4c = 0;
            iVar5 = 1;
            uVar4 = 0;
          }
        }
      }
      pcVar8 = pcVar8 + -1;
    } while (pcVar8 != (s->_M_dataplus)._M_p);
  }
  iVar5 = std::__cxx11::string::compare((char *)s);
  if (iVar5 == 0) {
    local_4c = 1;
  }
  iVar2._M_current =
       (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&local_4c);
    puVar6 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_4c;
    puVar6 = iVar2._M_current + 1;
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
  }
  puVar3 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (puVar6 == puVar3) {
LAB_001249aa:
      this->negative = false;
      return;
    }
    puVar7 = puVar6 + -1;
    if (*puVar7 != 0) {
      if (puVar6 != puVar3) {
        return;
      }
      goto LAB_001249aa;
    }
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
    puVar6 = puVar7;
  } while( true );
}

Assistant:

BigInteger::BigInteger(const std::string &s): digits(), negative(false)
{
    unsigned temp = 0;
    unsigned pow = 1;
    for(auto i = s.crbegin(); i != s.crend(); ++i)
    {
        if(*i == '-' || *i == '+')
        {
            if(*i == '-')
                negative = true;
            continue;
        }
        if(*i < '0' || *i > '9')
            throw invalid_number_error("Invalid integer: " + s);
        temp += pow * (*i - '0');
        pow *= 10;
        if(pow == BLOCK_MOD)
        {
            pow = 1;
            digits.push_back(temp);
            temp = 0;
        }
    }
    if(s == "-")
        temp = 1;
    digits.push_back(temp);
    normalize();
}